

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

bool test_uintwide_t_edge::test_various_edge_operations(void)

{
  pointer *ppvVar1;
  byte bVar2;
  bool bVar3;
  __type _Var4;
  uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> *puVar5;
  uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *puVar6;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *pdVar7;
  iterator pvVar8;
  iterator pvVar9;
  byte local_c0e2;
  byte local_c0ba;
  __type local_c091;
  bool local_bf92;
  bool local_bf72;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> local_bf68;
  undefined1 local_bf49;
  uint local_bf48;
  uint uStack_bf44;
  bool result_fill_with_effs_is_ok;
  undefined1 local_bf3d;
  uint local_bf3c;
  undefined1 local_bf38 [3];
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> result_fill_with_zero_is_ok;
  local_derived_uint_type dt;
  undefined1 local_bf18 [7];
  bool result_is_ok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bef8;
  undefined1 local_bed1;
  int local_bed0;
  uint uStack_becc;
  __type result08_is_ok;
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bec8;
  type local_b6b8;
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_aea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a678;
  byte local_a651;
  int local_a650;
  uint uStack_a64c;
  __type result07_is_ok;
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a648;
  type local_9e38;
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9628;
  undefined4 local_8e14;
  unsigned_long_long uStack_8e10;
  int signed_shift_amount;
  undefined1 local_8e08 [8];
  boost_uint_type u_mid_boost;
  uint local_85ec;
  undefined1 local_85e8 [8];
  local_uint_type u_mid_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_85b0;
  byte local_8589;
  undefined1 local_8588 [7];
  __type result06_is_ok;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_7d78;
  int local_7d60 [2];
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7d58;
  undefined1 local_7548 [8];
  boost_uint_type one_limb_effs_prior_to_half_and_zeros_boost;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_6d30;
  undefined1 local_6d18 [8];
  local_uint_type one_limb_effs_prior_to_half_and_zeros_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6ce0;
  byte local_6cb9;
  undefined1 local_6cb8 [7];
  bool result05_is_ok;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_64a8;
  char *local_6490;
  undefined1 local_6488 [8];
  boost_uint_type u_one_quarter_effs_and_zeros_boost;
  char *local_5c70;
  undefined1 local_5c68 [8];
  local_uint_type u_one_quarter_effs_and_zeros_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c48;
  allocator<char> local_5c21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c00;
  undefined1 local_5be0 [8];
  string str_one_quarter_effs_and_zeros;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5ba0;
  byte local_5b79;
  undefined1 local_5b78 [7];
  __type result04_is_ok;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_5368;
  char *local_5350;
  undefined1 local_5348 [8];
  boost_uint_type u_three_quarter_effs_and_zeros_boost;
  char *local_4b30;
  undefined1 local_4b28 [8];
  local_uint_type u_three_quarter_effs_and_zeros_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b08;
  allocator<char> local_4ae1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4ac0;
  undefined1 local_4aa0 [8];
  string str_three_quarter_effs_and_zeros;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a60;
  byte local_4a39;
  undefined1 local_4a38 [7];
  __type result03_is_ok;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_4228;
  char *local_4210;
  undefined1 local_4208 [8];
  boost_uint_type u_seven_and_effs_boost;
  undefined1 local_39f0 [8];
  local_uint_type u_seven_and_effs_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_39d0;
  undefined1 local_39b0 [8];
  string str_seven_and_effs;
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3988;
  uint local_316c;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_3168;
  byte local_314d;
  uint local_314c;
  undefined1 local_3148 [3];
  bool result02_is_ok;
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2938;
  uint local_2124;
  type local_2120;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_2108;
  uint local_20ec;
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_20e8;
  uint local_18cc;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_18c8;
  byte local_18a9;
  undefined1 local_18a8 [7];
  bool result01_is_ok;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_1090;
  undefined1 local_1078 [8];
  boost_uint_type result_boost;
  undefined1 local_860 [8];
  local_uint_type result_local;
  undefined1 local_838 [8];
  number_type u_max_boost;
  undefined1 local_20 [8];
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  u_max_local;
  
  std::
  numeric_limits<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>_>
  ::max();
  std::
  numeric_limits<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::max();
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
            *)local_860);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
            *)local_1078);
  boost::multiprecision::operator*
            (&local_1090,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_20,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_20);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_860,&local_1090);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_1090);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_18a8,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_838,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_838);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1078,
              (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_18a8);
  local_18cc = 1;
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::number<unsigned_int>(&local_18c8,&local_18cc,(type *)0x0);
  bVar3 = boost::multiprecision::operator==
                    ((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
                      *)local_860,&local_18c8);
  local_bf72 = false;
  if (bVar3) {
    local_20ec = 1;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
    ::number<unsigned_int>(&local_20e8,&local_20ec,(type *)0x0);
    local_bf72 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_1078,&local_20e8);
  }
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_18c8);
  local_18a9 = local_bf72;
  local_2124 = 1;
  boost::multiprecision::operator-
            (&local_2120,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_20,&local_2124);
  boost::multiprecision::operator*
            (&local_2108,&local_2120,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_20);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_860,&local_2108);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_2108);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_2120);
  local_314c = 1;
  boost::multiprecision::operator-
            ((type *)local_3148,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_838,&local_314c);
  boost::multiprecision::operator*
            (&local_2938,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_3148,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_838);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1078,&local_2938);
  local_316c = 2;
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::number<unsigned_int>(&local_3168,&local_316c,(type *)0x0);
  bVar3 = boost::multiprecision::operator==
                    ((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
                      *)local_860,&local_3168);
  local_bf92 = false;
  if (bVar3) {
    str_seven_and_effs.field_2._12_4_ = 2;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
    ::number<unsigned_int>
              (&local_3988,(uint *)(str_seven_and_effs.field_2._M_local_buf + 0xc),(type *)0x0);
    local_bf92 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_1078,&local_3988);
  }
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_3168);
  local_314d = local_bf92;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_39d0,0xfff,'F',
             (allocator<char> *)
             ((long)&u_seven_and_effs_local.m_backend.m_value.values.
                     super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                     .elems + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_39b0,
                 "0x7",&local_39d0);
  std::__cxx11::string::~string((string *)&local_39d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u_seven_and_effs_local.m_backend.m_value.values.
                     super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                     .elems + 7));
  u_seven_and_effs_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  ._2056_8_ = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_39b0);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
              *)local_39f0,
             (char **)&u_seven_and_effs_boost.m_backend.
                       super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                       .field_0x808,(type *)0x0);
  local_4210 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_39b0
                    );
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)local_4208,&local_4210,(type *)0x0);
  boost::multiprecision::operator*
            (&local_4228,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_39f0,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_39f0);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_860,&local_4228);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_4228);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_4a38,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_4208,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_4208);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1078,
              (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_4a38);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            (&local_4a60,
             (number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
              *)local_860);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&str_three_quarter_effs_and_zeros.field_2 + 8),
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)local_1078);
  _Var4 = std::operator==(&local_4a60,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (str_three_quarter_effs_and_zeros.field_2._M_local_buf + 8));
  std::__cxx11::string::~string
            ((string *)(str_three_quarter_effs_and_zeros.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_4a60);
  local_4a39 = _Var4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4ae0,0x3000,'F',&local_4ae1);
  std::operator+(&local_4ac0,"0x",&local_4ae0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b08,0x1000,'0',
             (allocator<char> *)
             ((long)&u_three_quarter_effs_and_zeros_local.m_backend.m_value.values.
                     super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                     .elems + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4aa0,
                 &local_4ac0,&local_4b08);
  std::__cxx11::string::~string((string *)&local_4b08);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u_three_quarter_effs_and_zeros_local.m_backend.m_value.values.
                     super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                     .elems + 7));
  std::__cxx11::string::~string((string *)&local_4ac0);
  std::__cxx11::string::~string((string *)&local_4ae0);
  std::allocator<char>::~allocator(&local_4ae1);
  local_4b30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4aa0
                    );
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
              *)local_4b28,&local_4b30,(type *)0x0);
  local_5350 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4aa0
                    );
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)local_5348,&local_5350,(type *)0x0);
  boost::multiprecision::operator*
            (&local_5368,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_4b28,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_4b28);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_860,&local_5368);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_5368);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_5b78,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_5348,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_5348);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1078,
              (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_5b78);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            (&local_5ba0,
             (number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
              *)local_860);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&str_one_quarter_effs_and_zeros.field_2 + 8),
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)local_1078);
  _Var4 = std::operator==(&local_5ba0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (str_one_quarter_effs_and_zeros.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(str_one_quarter_effs_and_zeros.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::~string((string *)&local_5ba0);
  local_5b79 = _Var4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c20,0x1000,'F',&local_5c21);
  std::operator+(&local_5c00,"0x",&local_5c20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c48,0x3000,'0',
             (allocator<char> *)
             ((long)&u_one_quarter_effs_and_zeros_local.m_backend.m_value.values.
                     super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                     .elems + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5be0,
                 &local_5c00,&local_5c48);
  std::__cxx11::string::~string((string *)&local_5c48);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u_one_quarter_effs_and_zeros_local.m_backend.m_value.values.
                     super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                     .elems + 7));
  std::__cxx11::string::~string((string *)&local_5c00);
  std::__cxx11::string::~string((string *)&local_5c20);
  std::allocator<char>::~allocator(&local_5c21);
  local_5c70 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5be0
                    );
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
              *)local_5c68,&local_5c70,(type *)0x0);
  local_6490 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5be0
                    );
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)local_6488,&local_6490,(type *)0x0);
  boost::multiprecision::operator*
            (&local_64a8,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_5c68,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_5c68);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_860,&local_64a8);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_64a8);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_6cb8,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_6488,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_6488);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1078,
              (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_6cb8);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            (&local_6ce0,
             (number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
              *)local_860);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &one_limb_effs_prior_to_half_and_zeros_local.m_backend.m_value.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elems,(number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                     *)local_1078);
  ppvVar1 = &one_limb_effs_prior_to_half_and_zeros_local.m_backend.m_value.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
  _Var4 = std::operator==(&local_6ce0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ppvVar1);
  std::__cxx11::string::~string((string *)ppvVar1);
  std::__cxx11::string::~string((string *)&local_6ce0);
  one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  ._2060_4_ = 0xffffffff;
  local_6cb9 = _Var4;
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::number<unsigned_int>
            (&local_6d30,
             (uint *)&one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
                      super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                      .field_0x80c,(type *)0x0);
  one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  ._2056_4_ = 0x1fe0;
  boost::multiprecision::operator<<
            ((type *)local_6d18,&local_6d30,
             (int *)&one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
                     super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                     .field_0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_6d30);
  local_7d60[1] = 0xffffffff;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number<unsigned_int>(&local_7d58,(uint *)(local_7d60 + 1),(type *)0x0);
  local_7d60[0] = 0x1fe0;
  boost::multiprecision::operator<<((type *)local_7548,&local_7d58,local_7d60);
  boost::multiprecision::operator*
            (&local_7d78,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_6d18,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_6d18);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_860,&local_7d78);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number(&local_7d78);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_8588,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_7548,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_7548);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1078,
              (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_8588);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            (&local_85b0,
             (number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
              *)local_860);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &u_mid_local.m_backend.m_value.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elems,(number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                     *)local_1078);
  ppvVar1 = &u_mid_local.m_backend.m_value.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
  _Var4 = std::operator==(&local_85b0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ppvVar1);
  std::__cxx11::string::~string((string *)ppvVar1);
  std::__cxx11::string::~string((string *)&local_85b0);
  local_85ec = 2;
  local_8589 = _Var4;
  boost::multiprecision::operator/
            ((type *)local_85e8,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)local_4b28,&local_85ec);
  uStack_8e10 = 2;
  boost::multiprecision::operator/
            ((type *)local_8e08,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_5348,&stack0xffffffffffff71f0);
  local_8e14 = 0xffffffd9;
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_860,
              (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_85e8);
  puVar5 = boost::multiprecision::
           number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
           ::backend((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
                      *)local_860);
  puVar6 = (uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *)
           boost::multiprecision::
           uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::representation
                     (puVar5);
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  operator>>=(puVar6,-0x27);
  uStack_a64c = 1;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number<unsigned_int>(&local_a648,&stack0xffffffffffff59b4,(type *)0x0);
  local_a650 = 0x27;
  boost::multiprecision::operator<<(&local_9e38,&local_a648,&local_a650);
  boost::multiprecision::operator*
            (&local_9628,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_8e08,&local_9e38);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1078,&local_9628);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            (&local_a678,
             (number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
              *)local_860);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            (&local_a698,
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)local_1078);
  _Var4 = std::operator==(&local_a678,&local_a698);
  std::__cxx11::string::~string((string *)&local_a698);
  std::__cxx11::string::~string((string *)&local_a678);
  local_a651 = _Var4;
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_860,
              (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
               *)local_85e8);
  puVar5 = boost::multiprecision::
           number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
           ::backend((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
                      *)local_860);
  puVar6 = (uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *)
           boost::multiprecision::
           uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::representation
                     (puVar5);
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  operator<<=(puVar6,-0x27);
  uStack_becc = 1;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number<unsigned_int>(&local_bec8,&stack0xffffffffffff4134,(type *)0x0);
  local_bed0 = 0x27;
  boost::multiprecision::operator<<(&local_b6b8,&local_bec8,&local_bed0);
  boost::multiprecision::operator/
            (&local_aea8,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_8e08,&local_b6b8);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1078,&local_aea8);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            (&local_bef8,
             (number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
              *)local_860);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf18,
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)local_1078);
  _Var4 = std::operator==(&local_bef8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_bf18);
  std::__cxx11::string::~string((string *)local_bf18);
  std::__cxx11::string::~string((string *)&local_bef8);
  local_c091 = false;
  if (((((local_18a9 & 1) != 0) && (local_c091 = false, (local_314d & 1) != 0)) &&
      (local_c091 = false, (local_4a39 & 1) != 0)) &&
     (((local_c091 = false, (local_5b79 & 1) != 0 && (local_c091 = false, (local_6cb9 & 1) != 0)) &&
      ((local_c091 = false, (local_8589 & 1) != 0 && (local_c091 = false, (local_a651 & 1) != 0)))))
     ) {
    local_c091 = _Var4;
  }
  dt.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ._7_1_ = local_c091;
  local_bed1 = _Var4;
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&(std::numeric_limits<unsigned_int>::digits<=std::
  numeric_limits<unsigned_int>::digits),void>::type__
            (local_bf38,0xfffffffd,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  pdVar7 = &math::wide_integer::
            uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::representation
                      ((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                       local_bf38)->
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>;
  pvVar8 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::begin
                     (pdVar7);
  pdVar7 = &math::wide_integer::
            uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::representation
                      ((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                       local_bf38)->
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>;
  pvVar9 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::end
                     (pdVar7);
  local_bf3c = 0;
  std::fill<unsigned_int*,unsigned_int>(pvVar8,pvVar9,&local_bf3c);
  uStack_bf44 = 0;
  local_bf3d = math::wide_integer::operator==
                         ((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                          local_bf38,&stack0xffffffffffff40bc);
  local_c0ba = 0;
  if ((bool)local_bf3d) {
    local_c0ba = dt.values.
                 super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                 elems._7_1_;
  }
  dt.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ._7_1_ = local_c0ba & 1;
  pdVar7 = &math::wide_integer::
            uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::representation
                      ((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                       local_bf38)->
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>;
  pvVar8 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::begin
                     (pdVar7);
  pdVar7 = &math::wide_integer::
            uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::representation
                      ((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                       local_bf38)->
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>;
  pvVar9 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::end
                     (pdVar7);
  local_bf48 = std::numeric_limits<unsigned_int>::max();
  std::fill<unsigned_int*,unsigned_int>(pvVar8,pvVar9,&local_bf48);
  math::wide_integer::
  numeric_limits_uintwide_t_base<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::max();
  bVar3 = math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>
          ::operator==((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                       local_bf38,&local_bf68);
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  ~uintwide_t(&local_bf68);
  local_c0e2 = 0;
  if (bVar3) {
    local_c0e2 = dt.values.
                 super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                 elems._7_1_;
  }
  dt.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ._7_1_ = local_c0e2 & 1;
  local_bf49 = bVar3;
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  ~uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_bf38);
  bVar2 = dt.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
          _7_1_;
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
             *)local_85e8);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
             *)local_6d18);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
             *)local_5c68);
  std::__cxx11::string::~string((string *)local_5be0);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
             *)local_4b28);
  std::__cxx11::string::~string((string *)local_4aa0);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
             *)local_39f0);
  std::__cxx11::string::~string((string *)local_39b0);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
             *)local_860);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  ::~number((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
             *)local_20);
  return (bool)(bVar2 & 1);
}

Assistant:

auto test_various_edge_operations() -> bool
{
  const auto u_max_local = (std::numeric_limits<local_uint_type>::max)();
  const auto u_max_boost = (std::numeric_limits<boost_uint_type>::max)();

  local_uint_type result_local;
  boost_uint_type result_boost;

  result_local = u_max_local * u_max_local;
  result_boost = u_max_boost * u_max_boost;

  const auto result01_is_ok = ((result_local == local_uint_type(static_cast<unsigned>(UINT8_C(1)))) && (result_boost == boost_uint_type(static_cast<unsigned>(UINT8_C(1)))));

  result_local = (u_max_local - 1U) * u_max_local;
  result_boost = (u_max_boost - 1U) * u_max_boost;

  const auto result02_is_ok = ((result_local == local_uint_type(static_cast<unsigned>(UINT8_C(2)))) && (result_boost == boost_uint_type(static_cast<unsigned>(UINT8_C(2)))));

  const std::string str_seven_and_effs =
    "0x7" + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) - static_cast<unsigned>(UINT8_C(1))), 'F');

  const local_uint_type u_seven_and_effs_local(str_seven_and_effs.c_str());
  const boost_uint_type u_seven_and_effs_boost(str_seven_and_effs.c_str());

  result_local = u_seven_and_effs_local * u_seven_and_effs_local;
  result_boost = u_seven_and_effs_boost * u_seven_and_effs_boost;

  const auto result03_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const std::string str_three_quarter_effs_and_zeros =
      "0x"
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(3))), 'F')
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(1))), '0')
    ;

  const local_uint_type u_three_quarter_effs_and_zeros_local(str_three_quarter_effs_and_zeros.c_str());
  const boost_uint_type u_three_quarter_effs_and_zeros_boost(str_three_quarter_effs_and_zeros.c_str());

  result_local = u_three_quarter_effs_and_zeros_local * u_three_quarter_effs_and_zeros_local;
  result_boost = u_three_quarter_effs_and_zeros_boost * u_three_quarter_effs_and_zeros_boost;

  const auto result04_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const std::string str_one_quarter_effs_and_zeros =
      "0x"
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(1))), 'F')
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(3))), '0')
    ;

  const local_uint_type u_one_quarter_effs_and_zeros_local(str_one_quarter_effs_and_zeros.c_str());
  const boost_uint_type u_one_quarter_effs_and_zeros_boost(str_one_quarter_effs_and_zeros.c_str());

  result_local = u_one_quarter_effs_and_zeros_local * u_one_quarter_effs_and_zeros_local;
  result_boost = u_one_quarter_effs_and_zeros_boost * u_one_quarter_effs_and_zeros_boost;

  const bool result05_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const local_uint_type one_limb_effs_prior_to_half_and_zeros_local(local_uint_type(UINT32_C(0xFFFFFFFF)) << ((std::numeric_limits<local_uint_type>::digits / 2) - 32));
  const boost_uint_type one_limb_effs_prior_to_half_and_zeros_boost(boost_uint_type(UINT32_C(0xFFFFFFFF)) << ((std::numeric_limits<boost_uint_type>::digits / 2) - 32));

  result_local = one_limb_effs_prior_to_half_and_zeros_local * one_limb_effs_prior_to_half_and_zeros_local;
  result_boost = one_limb_effs_prior_to_half_and_zeros_boost * one_limb_effs_prior_to_half_and_zeros_boost;

  const auto result06_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const local_uint_type u_mid_local = u_three_quarter_effs_and_zeros_local / static_cast<typename local_uint_type::backend_type::representation_type::limb_type>(UINT8_C(2));
  const boost_uint_type u_mid_boost = u_three_quarter_effs_and_zeros_boost / static_cast<typename std::iterator_traits<boost_uint_type::backend_type::limb_pointer>::value_type>(UINT8_C(2));

  constexpr auto signed_shift_amount =
    static_cast<int>
    (
      -(std::numeric_limits<typename local_uint_type::backend_type::representation_type::limb_type>::digits + 7)
    );

  result_local = u_mid_local;
  result_local.backend().representation() >>= signed_shift_amount;
  result_boost = u_mid_boost * (boost_uint_type(1U) << (-signed_shift_amount));

  const auto result07_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  result_local = u_mid_local;
  result_local.backend().representation() <<= signed_shift_amount;
  result_boost = u_mid_boost / (boost_uint_type(1U) << (-signed_shift_amount));

  const auto result08_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  auto result_is_ok = (   result01_is_ok
                       && result02_is_ok
                       && result03_is_ok
                       && result04_is_ok
                       && result05_is_ok
                       && result06_is_ok
                       && result07_is_ok
                       && result08_is_ok);

  {
    using local_derived_uint_type = typename local_uint_type::backend_type::representation_type;
    using local_limb_type         = local_derived_uint_type::limb_type;

    local_derived_uint_type dt(static_cast<local_limb_type>(INT8_C(-3)));

    std::fill(dt.representation().begin(), dt.representation().end(), static_cast<local_limb_type>(UINT8_C(0)));

    const auto result_fill_with_zero_is_ok = (dt == 0U);

    result_is_ok = (result_fill_with_zero_is_ok && result_is_ok);

    std::fill(dt.representation().begin(), dt.representation().end(), (std::numeric_limits<local_limb_type>::max)());

    const auto result_fill_with_effs_is_ok = (dt == (std::numeric_limits<local_derived_uint_type>::max)());

    result_is_ok = (result_fill_with_effs_is_ok && result_is_ok);
  }

  return result_is_ok;
}